

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  undefined8 *puVar1;
  size_type *psVar2;
  tm *ptVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  tm time_struct;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  int local_8c;
  tm local_88;
  string local_50;
  
  local_1d0 = (ulong *)((long)this / 1000);
  ptVar3 = localtime_r((time_t *)&local_1d0,&local_88);
  if (ptVar3 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_8c = local_88.tm_year + 0x76c;
  StreamableToString<int>(&local_50,&local_8c);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1a0 = *puVar6;
    lStack_198 = plVar4[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar6;
    local_1b0 = (ulong *)*plVar4;
  }
  local_1a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_b0,(String *)(ulong)(local_88.tm_mon + 1),(int)local_1a8);
  uVar7 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar7 = local_1a0;
  }
  if (uVar7 < local_b0._M_string_length + local_1a8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_b0._M_string_length + local_1a8) goto LAB_0012034b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_0012034b:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_b0._M_dataplus._M_p);
  }
  local_250 = &local_240;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_240 = *puVar1;
    uStack_238 = puVar5[3];
  }
  else {
    local_240 = *puVar1;
    local_250 = (undefined8 *)*puVar5;
  }
  local_248 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_180 = *puVar6;
    lStack_178 = plVar4[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar6;
    local_190 = (ulong *)*plVar4;
  }
  local_188 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_d0,(String *)(ulong)(uint)local_88.tm_mday,(int)local_188);
  uVar7 = 0xf;
  if (local_190 != &local_180) {
    uVar7 = local_180;
  }
  if (uVar7 < local_d0._M_string_length + local_188) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar8 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_d0._M_string_length + local_188) goto LAB_00120483;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00120483:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_d0._M_dataplus._M_p);
  }
  local_230 = &local_220;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_220 = *puVar1;
    uStack_218 = puVar5[3];
  }
  else {
    local_220 = *puVar1;
    local_230 = (undefined8 *)*puVar5;
  }
  local_228 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_160 = *puVar6;
    lStack_158 = plVar4[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar6;
    local_170 = (ulong *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_f0,(String *)(ulong)(uint)local_88.tm_hour,(int)local_168);
  uVar7 = 0xf;
  if (local_170 != &local_160) {
    uVar7 = local_160;
  }
  if (uVar7 < local_f0._M_string_length + local_168) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar8 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_f0._M_string_length + local_168) goto LAB_001205bd;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_001205bd:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0._M_dataplus._M_p);
  }
  local_210 = &local_200;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_200 = *puVar1;
    uStack_1f8 = puVar5[3];
  }
  else {
    local_200 = *puVar1;
    local_210 = (undefined8 *)*puVar5;
  }
  local_208 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_140 = *puVar6;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar6;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_110,(String *)(ulong)(uint)local_88.tm_min,(int)local_148);
  uVar7 = 0xf;
  if (local_150 != &local_140) {
    uVar7 = local_140;
  }
  if (uVar7 < local_110._M_string_length + local_148) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar8 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_110._M_string_length + local_148) goto LAB_001206f6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001206f6:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_110._M_dataplus._M_p);
  }
  local_1f0 = &local_1e0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1e0 = *puVar1;
    uStack_1d8 = puVar5[3];
  }
  else {
    local_1e0 = *puVar1;
    local_1f0 = (undefined8 *)*puVar5;
  }
  local_1e8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1c0 = *puVar6;
    lStack_1b8 = plVar4[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar6;
    local_1d0 = (ulong *)*plVar4;
  }
  local_1c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_130,(String *)(ulong)(uint)local_88.tm_sec,(int)local_1c8);
  uVar7 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar7 = local_1c0;
  }
  if (uVar7 < local_130._M_string_length + local_1c8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar8 = local_130.field_2._M_allocated_capacity;
    }
    if (local_130._M_string_length + local_1c8 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_1d0);
      goto LAB_0012084e;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_130._M_dataplus._M_p);
LAB_0012084e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar8 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}